

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorted_aggregate_function.cpp
# Opt level: O3

void duckdb::SortedAggregateFunction::SimpleUpdate
               (Vector *inputs,AggregateInputData *aggr_input_data,idx_t input_count,
               data_ptr_t state,idx_t count)

{
  DataChunk sort_input;
  DataChunk arg_input;
  SortedAggregateBindData order_bind;
  DataChunk local_280;
  DataChunk local_240;
  undefined1 local_200 [344];
  _Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_> local_a8;
  vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_> local_a0;
  vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_> local_88;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_70 [24];
  vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_> local_58 [2];
  
  optional_ptr<duckdb::FunctionData,_true>::CheckValid(&aggr_input_data->bind_data);
  SortedAggregateBindData::SortedAggregateBindData
            ((SortedAggregateBindData *)local_200,
             (SortedAggregateBindData *)(aggr_input_data->bind_data).ptr);
  DataChunk::DataChunk(&local_240);
  DataChunk::DataChunk(&local_280);
  ProjectInputs(inputs,(SortedAggregateBindData *)local_200,input_count,count,&local_240,&local_280)
  ;
  SortedAggregateState::Update((SortedAggregateState *)state,aggr_input_data,&local_280,&local_240);
  DataChunk::~DataChunk(&local_280);
  DataChunk::~DataChunk(&local_240);
  local_200._0_8_ = &PTR__SortedAggregateBindData_01982530;
  ::std::vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>::
  ~vector(local_58);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(local_70);
  ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::~vector
            (&local_88);
  ::std::vector<duckdb::ListSegmentFunctions,_std::allocator<duckdb::ListSegmentFunctions>_>::
  ~vector(&local_a0);
  if (local_a8.super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl !=
      (FunctionData *)0x0) {
    (*(*(_func_int ***)local_a8.super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl)
      [1])();
  }
  local_a8.super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl =
       (_Head_base<0UL,_duckdb::FunctionData_*,_false>)(FunctionData *)0x0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
             (local_200 + 0x140));
  local_200._16_8_ = &PTR__AggregateFunction_01966bf8;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_200._312_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_200._312_8_);
  }
  BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)(local_200 + 0x10));
  FunctionData::~FunctionData((FunctionData *)local_200);
  return;
}

Assistant:

static void SimpleUpdate(Vector inputs[], AggregateInputData &aggr_input_data, idx_t input_count, data_ptr_t state,
	                         idx_t count) {
		const auto order_bind = aggr_input_data.bind_data->Cast<SortedAggregateBindData>();
		DataChunk arg_input;
		DataChunk sort_input;
		ProjectInputs(inputs, order_bind, input_count, count, arg_input, sort_input);

		const auto order_state = reinterpret_cast<SortedAggregateState *>(state);
		order_state->Update(aggr_input_data, sort_input, arg_input);
	}